

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall
YAJLScan::YAJLScan(YAJLScan *this,YAJLMiscData *misc,YAJLFrameHeader *fheader,bitio_stream *bstream)

{
  undefined8 *puVar1;
  pointer pYVar2;
  pointer pYVar3;
  pointer pYVar4;
  pointer pYVar5;
  void *pvVar6;
  u16 marker;
  long lVar7;
  ssize_t sVar8;
  ulong uVar9;
  reference pvVar10;
  undefined8 extraout_RAX;
  pointer pYVar11;
  uint uVar12;
  int iVar13;
  YAJLFrameHeader *extraout_RDX;
  YAJLFrameHeader *extraout_RDX_00;
  YAJLFrameHeader *extraout_RDX_01;
  YAJLFrameHeader *extraout_RDX_02;
  void *__buf;
  uint uVar14;
  YAJLScan *this_00;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  float fVar18;
  YAJLScan *local_a0;
  float local_94;
  YAJLFrameHeader *local_90;
  ulong local_88;
  float local_7c;
  vector<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_> *local_78;
  vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>> *local_70;
  YAJLScanHeader local_68;
  ulong local_40;
  pointer local_38;
  
  lVar7 = 0x48;
  do {
    puVar1 = (undefined8 *)((long)&(this->tables).qtables[0].coeffs + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x108);
  local_78 = &(this->header).specs;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pYVar11 = (pointer)&this->mcus;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = (YAJLScan *)bstream;
  local_90 = fheader;
  local_70 = (vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>> *)pYVar11;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          this_00 = local_a0;
          sVar8 = bitio::bitio_stream::read((bitio_stream *)local_a0,0x10,fheader,(size_t)pYVar11);
          uVar14 = (uint)sVar8;
          pYVar11 = (pointer)(ulong)(uVar14 & 0xfff0);
          if ((short)(uVar14 & 0xfff0) != -0x20) break;
          YAJLMiscData::fetch_app_data(misc,(bitio_stream *)local_a0);
          fheader = extraout_RDX;
        }
        marker = (u16)sVar8;
        if (marker != 0xffdb) break;
        YAJLTables::fetch_qtable(&this->tables,(bitio_stream *)local_a0);
        fheader = extraout_RDX_01;
      }
      if ((uVar14 & 0xffff) != 0xfffe) break;
      YAJLMiscData::fetch_comment(misc,(bitio_stream *)local_a0);
      fheader = extraout_RDX_00;
    }
    pYVar11 = (pointer)(ulong)(uVar14 & 0xfff7);
    if ((uVar14 & 0xfff7) != 0xffc4) break;
    YAJLTables::fetch_etable(&this->tables,marker,(bitio_stream *)local_a0);
    fheader = extraout_RDX_02;
  }
  if (marker != 0xffda) {
    YAJLScan(this_00);
    pvVar6 = *(void **)local_70;
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)(this->mcus).
                                   super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6
                     );
    }
    pYVar2 = (local_78->super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    if (pYVar2 != (pointer)0x0) {
      operator_delete(pYVar2,(long)(this->header).specs.
                                   super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pYVar2
                     );
    }
    _Unwind_Resume(extraout_RAX);
  }
  YAJLScanHeader::YAJLScanHeader(&local_68,(bitio_stream *)local_a0);
  (this->header).ncomponents = local_68.ncomponents;
  pYVar2 = (this->header).specs.
           super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  pYVar3 = (this->header).specs.
           super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pYVar2 == (pointer)0x0) {
    (this->header).select_start = local_68.select_start;
    (this->header).select_end = local_68.select_end;
    (this->header).ah = local_68.ah;
    (this->header).al = local_68.al;
  }
  else {
    operator_delete(pYVar2,(long)pYVar3 - (long)pYVar2);
    (this->header).select_start = local_68.select_start;
    (this->header).select_end = local_68.select_end;
    (this->header).ah = local_68.ah;
    (this->header).al = local_68.al;
    if (local_68.specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.specs.
                      super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.specs.
                            super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.specs.
                            super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pYVar4 = (local_90->specs).
           super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  pYVar5 = (local_90->specs).
           super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pYVar4 == pYVar5) {
    fVar18 = 0.0;
  }
  else {
    uVar14 = 0;
    pYVar11 = pYVar4;
    do {
      uVar12 = uVar14 & 0xff;
      uVar14 = (uint)pYVar11->vertical_sampling_factor * (uint)pYVar11->horizontal_sampling_factor;
      if (uVar14 <= uVar12) {
        uVar14 = uVar12;
      }
      pYVar11 = pYVar11 + 1;
    } while (pYVar11 != pYVar5);
    fVar18 = (float)((uVar14 & 0xff) << 6);
  }
  uVar9 = (ulong)(this->header).ncomponents;
  local_88 = uVar9;
  if (uVar9 != 0) {
    local_7c = (float)(int)((uint)local_90->nsamples_per_line * (uint)local_90->nlines);
    uVar15 = 0;
    uVar17 = 0;
    local_94 = fVar18;
    do {
      uVar14 = (uint)pYVar4[uVar15].vertical_sampling_factor *
               (uint)pYVar4[uVar15].horizontal_sampling_factor;
      pYVar11 = (pointer)(ulong)uVar14;
      fVar18 = ceilf(((float)uVar14 * local_7c) / local_94);
      uVar17 = (ulong)((float)(uVar17 & 0xffffffff) + fVar18);
      uVar15 = uVar15 + 1;
    } while (uVar9 != uVar15);
    if ((int)uVar17 != 0) {
      iVar13 = 0;
      fVar18 = 0.0;
      local_40 = uVar17;
      do {
        uVar9 = (ulong)(local_78->
                       super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>).
                       _M_impl.super__Vector_impl_data._M_start[iVar13].component_selector;
        pYVar11 = (local_90->specs).
                  super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        iVar16 = (uint)pYVar11[uVar9 - 1].vertical_sampling_factor *
                 (uint)pYVar11[uVar9 - 1].horizontal_sampling_factor;
        if (iVar16 != 0) {
          local_94 = (float)((int)fVar18 + iVar16);
          do {
            local_38 = (this->header).specs.
                       super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
                       _M_impl.super__Vector_impl_data._M_start + (uVar9 - 1);
            local_68._0_8_ = this;
            pvVar10 = std::vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>>::
                      emplace_back<bitio::bitio_stream*&,YAJLTables*,YAJLScanHeaderSpec*>
                                (local_70,(bitio_stream **)&local_a0,(YAJLTables **)&local_68,
                                 &local_38);
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
          local_88 = CONCAT71((int7)((ulong)pvVar10 >> 8),(this->header).ncomponents);
          fVar18 = local_94;
        }
        pYVar11 = (pointer)(local_88 & 0xff);
        iVar13 = (iVar13 + 1) % (int)pYVar11;
      } while ((uint)fVar18 < (uint)(float)local_40);
    }
  }
  bitio::bitio_stream::force_align((bitio_stream *)local_a0);
  sVar8 = bitio::bitio_stream::read((bitio_stream *)local_a0,0x10,__buf,(size_t)pYVar11);
  printf("%x\n",sVar8);
  printf("Run completed at: %s for \'Scan\'\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp")
  ;
  return;
}

Assistant:

YAJLScan::YAJLScan(YAJLMiscData *misc, YAJLFrameHeader *fheader, bitio::bitio_stream *bstream) {
    // we fill YAJLScan with data fetch directly over bitio streams.
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::SOS) {
            header = YAJLScanHeader(bstream);
            // scan for MCUs here
            // if Ns > 1, then the MCUs are interleaved. refer B.2.3 from ISO 10918
            // the interleaved components are ordered in this fashion: Cs1, Cs2 ... Csj

            int index = 0;
            u32 mcu_count = 0;
            u32 mcu_max_count = 0;
            u8 max_sampling_factor = 0;
            for (auto spec : fheader->specs) {
                auto sfactor = spec.horizontal_sampling_factor * spec.vertical_sampling_factor;
                if (max_sampling_factor < sfactor) {
                    max_sampling_factor = sfactor;
                }
            }

            for (int i = 0; i < header.ncomponents; i++) {
                auto sampling_factor = fheader->specs[i].horizontal_sampling_factor * fheader->specs[i].vertical_sampling_factor;
                mcu_max_count += ceil((float) (fheader->nlines * fheader->nsamples_per_line) * sampling_factor / (64 * max_sampling_factor));
            }

            while (mcu_count < mcu_max_count) {

                auto cmp_id = header.specs[index].component_selector - 1;
                auto fspec = fheader->specs[cmp_id];
                for (int r = 0; r < fspec.vertical_sampling_factor * fspec.horizontal_sampling_factor; r++) {
                    mcus.emplace_back(bstream, &tables, &header.specs[cmp_id]);
                    mcu_count++;
                }
                index = (index + 1) % header.ncomponents;
            }

            bstream->force_align();
            printf("%x\n", bstream->read(0x10));

#ifdef DEBUG
            printf("Run completed at: %s for 'Scan'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}